

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int fixed_mmu_map_address_mips
              (CPUMIPSState *env,hwaddr *physical,int *prot,target_ulong_conflict address,int rw,
              int access_type)

{
  uint uVar1;
  
  if ((int)address < 0) {
    uVar1 = address & 0x1fffffff;
    if (0xbfffffff < address) {
      uVar1 = address;
    }
  }
  else {
    uVar1 = (~env->CP0_Status & 4U) * 0x10000000 + address;
  }
  *physical = (ulong)uVar1;
  *prot = 7;
  return 0;
}

Assistant:

int fixed_mmu_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                          target_ulong address, int rw, int access_type)
{
    if (address <= (int32_t)0x7FFFFFFFUL) {
        if (!(env->CP0_Status & (1 << CP0St_ERL))) {
            *physical = address + 0x40000000UL;
        } else {
            *physical = address;
        }
    } else if (address <= (int32_t)0xBFFFFFFFUL) {
        *physical = address & 0x1FFFFFFF;
    } else {
        *physical = address;
    }

    *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
    return TLBRET_MATCH;
}